

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O0

bool __thiscall ON_PointCloud::PointIsHidden(ON_PointCloud *this,int point_index)

{
  int iVar1;
  int iVar2;
  bool *pbVar3;
  byte local_25;
  int point_count;
  int point_index_local;
  ON_PointCloud *this_local;
  
  if (-1 < point_index) {
    iVar1 = ON_SimpleArray<ON_3dPoint>::Count(&(this->m_P).super_ON_SimpleArray<ON_3dPoint>);
    if (point_index < iVar1) {
      iVar2 = ON_SimpleArray<bool>::Count(&this->m_H);
      if (iVar2 == iVar1) {
        pbVar3 = ON_SimpleArray<bool>::operator[](&this->m_H,point_index);
        local_25 = *pbVar3;
        goto LAB_007f3d0c;
      }
    }
  }
  local_25 = 0;
LAB_007f3d0c:
  return (bool)(local_25 & 1);
}

Assistant:

bool ON_PointCloud::PointIsHidden( int point_index ) const
{
  int point_count;
  return (    point_index >= 0
           && point_index < (point_count = m_P.Count())
           && m_H.Count() == point_count )
           ? m_H[point_index]
           : false;
}